

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O2

bool __thiscall DReachabilityPropagator::propagateNewEdge(DReachabilityPropagator *this,int edge)

{
  pointer piVar1;
  bool bVar2;
  vector<int,_std::allocator<int>_> *__range1;
  int *added_node;
  pointer __v;
  vector<int,_std::allocator<int>_> added_nodes;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = GraphPropagator::coherence_innodes
                    (&this->super_GraphPropagator,edge,
                     (vector<int,_std::allocator<int>_> *)&local_48);
  piVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
  if (bVar2) {
    for (__v = local_48._M_impl.super__Vector_impl_data._M_start; __v != piVar1; __v = __v + 1) {
      Tint::operator=(this->last_state_n + *__v,0);
      add_innode(this,*__v);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &this->new_node,__v);
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return bVar2;
}

Assistant:

bool DReachabilityPropagator::propagateNewEdge(int edge) {
	assert(getEdgeVar(edge).isFixed());
	assert(getEdgeVar(edge).isTrue());
	std::vector<int> added_nodes;
	const bool ok = GraphPropagator::coherence_innodes(edge, added_nodes);
	if (!ok) {
		return false;
	}
	for (const int& added_node : added_nodes) {
		if (DEBUG) {
			std::cout << "Adding in " << __FILE__ << __LINE__ << '\n';
		}
		last_state_n[added_node] = VT_IN;
		add_innode(added_node);
		new_node.insert(added_node);
	}
	return true;
}